

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGhsMultiGenerator::Generate(cmGlobalGhsMultiGenerator *this)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  string *psVar3;
  cmGlobalGhsMultiGenerator *pcVar4;
  string fname;
  cmGeneratedFileStream ftarget;
  cmGeneratedFileStream frule;
  string local_4d0;
  undefined1 local_4b0 [584];
  __buckets_ptr local_268;
  __node_base local_258;
  
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  for (p_Var2 = (this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    OutputTopLevelProject
              (this,(cmLocalGenerator *)**(undefined8 **)(p_Var2 + 2),
               (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)(p_Var2 + 2));
  }
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_268 = &stack0xfffffffffffffda8._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffd98,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&stack0xfffffffffffffd98);
  std::__cxx11::string::operator=((string *)&local_4d0,(string *)&stack0xfffffffffffffd98);
  if ((__node_base *)local_268 != &stack0xfffffffffffffda8) {
    operator_delete(local_268,(ulong)((long)&(local_258._M_nxt)->_M_nxt + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&stack0xfffffffffffffd98,&local_4d0,false,None);
  pcVar4 = (cmGlobalGhsMultiGenerator *)&stack0xfffffffffffffd98;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar4,true);
  WriteFileHeader(pcVar4,(ostream *)&stack0xfffffffffffffd98);
  WriteCustomRuleBOD(pcVar4,(ostream *)&stack0xfffffffffffffd98);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)&stack0xfffffffffffffd98);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_4b0._0_8_ = local_4b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4b0,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append(local_4b0);
  std::__cxx11::string::operator=((string *)&local_4d0,(string *)local_4b0);
  if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
    operator_delete((void *)local_4b0._0_8_,(ulong)(local_4b0._16_8_ + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4b0,&local_4d0,false,None);
  pcVar4 = (cmGlobalGhsMultiGenerator *)local_4b0;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar4,true);
  WriteFileHeader(pcVar4,(ostream *)local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b0,
             "FileTypes {\n  CmakeTarget {\n    name = \"Custom Target\"\n    action = \"&Execute\"\n    grepable = false\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
             ,0x98);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_4b0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&stack0xfffffffffffffd98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::Generate()
{
  std::string fname;

  // first do the superclass method
  this->cmGlobalGenerator::Generate();

  // output top-level projects
  for (auto& it : this->ProjectMap) {
    this->OutputTopLevelProject(it.second[0], it.second);
  }

  // create custom rule BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_rule.bod";
  cmGeneratedFileStream frule(fname);
  frule.SetCopyIfDifferent(true);
  this->WriteFileHeader(frule);
  this->WriteCustomRuleBOD(frule);
  frule.Close();

  // create custom target BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_target.bod";
  cmGeneratedFileStream ftarget(fname);
  ftarget.SetCopyIfDifferent(true);
  this->WriteFileHeader(ftarget);
  this->WriteCustomTargetBOD(ftarget);
  ftarget.Close();
}